

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O0

void sys_unbashfilename(char *from,char *to)

{
  char *pcStack_18;
  char c;
  char *to_local;
  char *from_local;
  
  pcStack_18 = to;
  to_local = from;
  while( true ) {
    if (*to_local == '\0') break;
    *pcStack_18 = *to_local;
    pcStack_18 = pcStack_18 + 1;
    to_local = to_local + 1;
  }
  *pcStack_18 = '\0';
  return;
}

Assistant:

void sys_unbashfilename(const char *from, char *to)
{
    char c;
    while ((c = *from++))
    {
#ifdef _WIN32
        if (c == '\\') c = '/';
#endif
        *to++ = c;
    }
    *to = 0;
}